

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_ConstAcc.h
# Opt level: O2

void __thiscall chrono::ChFunction_ConstAcc::Set_aw(ChFunction_ConstAcc *this,double m_aw)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = m_aw;
  auVar1 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar2._0_16_);
  auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
  this->aw = auVar1._0_8_;
  if (auVar1._0_8_ < this->av) {
    this->aw = this->av;
  }
  return;
}

Assistant:

void Set_aw(double m_aw) {
        if (m_aw < 0)
            m_aw = 0;
        if (m_aw > 1)
            m_aw = 1;
        aw = m_aw;
        if (aw < av)
            aw = av;
    }